

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

WAVE_FEATURE Diligent::VkSubgroupFeatureFlagsToWaveFeatures(VkSubgroupFeatureFlags FeatureFlags)

{
  type tVar1;
  WAVE_FEATURE local_10;
  VkSubgroupFeatureFlags Feature;
  WAVE_FEATURE Result;
  VkSubgroupFeatureFlags FeatureFlags_local;
  
  local_10 = WAVE_FEATURE_UNKNOWN;
  Feature = FeatureFlags;
  while (Feature != 0) {
    tVar1 = ExtractLSB<unsigned_int>(&Feature);
    if (tVar1 == 1) {
      operator|=(&local_10,WAVE_FEATURE_BASIC);
    }
    else if (tVar1 == 2) {
      operator|=(&local_10,WAVE_FEATURE_VOTE);
    }
    else if (tVar1 == 4) {
      operator|=(&local_10,WAVE_FEATURE_ARITHMETIC);
    }
    else if (tVar1 == 8) {
      operator|=(&local_10,WAVE_FEATURE_BALLOUT);
    }
    else if (tVar1 == 0x10) {
      operator|=(&local_10,WAVE_FEATURE_SHUFFLE);
    }
    else if (tVar1 == 0x20) {
      operator|=(&local_10,WAVE_FEATURE_SHUFFLE_RELATIVE);
    }
    else if (tVar1 == 0x40) {
      operator|=(&local_10,WAVE_FEATURE_CLUSTERED);
    }
    else if (tVar1 == 0x80) {
      operator|=(&local_10,WAVE_FEATURE_LAST);
    }
  }
  return local_10;
}

Assistant:

WAVE_FEATURE VkSubgroupFeatureFlagsToWaveFeatures(VkSubgroupFeatureFlags FeatureFlags)
{
    WAVE_FEATURE Result = WAVE_FEATURE_UNKNOWN;
    while (FeatureFlags != 0)
    {
        VkSubgroupFeatureFlags Feature = ExtractLSB(FeatureFlags);
        static_assert(WAVE_FEATURE_LAST == WAVE_FEATURE_QUAD,
                      "Please update the switch below to handle the new wave feature");
        switch (Feature)
        {
            // clang-format off
            case VK_SUBGROUP_FEATURE_BASIC_BIT:            Result |= WAVE_FEATURE_BASIC;            break;
            case VK_SUBGROUP_FEATURE_VOTE_BIT:             Result |= WAVE_FEATURE_VOTE;             break;
            case VK_SUBGROUP_FEATURE_ARITHMETIC_BIT:       Result |= WAVE_FEATURE_ARITHMETIC;       break;
            case VK_SUBGROUP_FEATURE_BALLOT_BIT:           Result |= WAVE_FEATURE_BALLOUT;          break;
            case VK_SUBGROUP_FEATURE_SHUFFLE_BIT:          Result |= WAVE_FEATURE_SHUFFLE;          break;
            case VK_SUBGROUP_FEATURE_SHUFFLE_RELATIVE_BIT: Result |= WAVE_FEATURE_SHUFFLE_RELATIVE; break;
            case VK_SUBGROUP_FEATURE_CLUSTERED_BIT:        Result |= WAVE_FEATURE_CLUSTERED;        break;
            case VK_SUBGROUP_FEATURE_QUAD_BIT:             Result |= WAVE_FEATURE_QUAD;             break;
            // clang-format on
            default:
                // Don't handle unknown features
                break;
        }
    }
    return Result;
}